

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O1

double integrate(function<double_(double)> *func,double a,double b,double h,int threads_num)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  vector<Argument,_std::allocator<Argument>_> args;
  pthread_mutex_t mutex;
  double local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<Argument,_std::allocator<Argument>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::vector<Argument,_std::allocator<Argument>_>::vector
            (&local_70,(long)threads_num,(allocator_type *)&local_58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,(long)threads_num,(allocator_type *)&local_58);
  iVar3 = 0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_90 = 0.0;
  if (0 < threads_num) {
    dVar6 = a;
    if (a <= b) {
      dVar6 = b;
      b = a;
    }
    dVar6 = (dVar6 - b) / (double)threads_num;
    lVar5 = 0x28;
    lVar4 = 0;
    do {
      dVar1 = (double)iVar3;
      iVar3 = iVar3 + 1;
      *(allocator_type **)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -0x28) = (allocator_type *)&local_58;
      *(double **)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -0x20) = &local_90;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -0x18) = dVar1 * dVar6 + b;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -0x10) = (double)iVar3 * dVar6 + b;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -8) = h;
      *(function<double_(double)> **)
       ((long)&(local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start)->mutex + lVar5) = func;
      pthread_create((pthread_t *)
                     ((long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4),(pthread_attr_t *)0x0,
                     integrate_thread,
                     (void *)((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x28));
      lVar5 = lVar5 + 0x30;
      lVar4 = lVar4 + 8;
    } while ((ulong)(uint)threads_num * 8 - lVar4 != 0);
  }
  if (0 < threads_num) {
    uVar2 = 0;
    do {
      pthread_join(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar2],(void **)0x0);
      uVar2 = uVar2 + 1;
    } while ((uint)threads_num != uVar2);
  }
  dVar6 = local_90;
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar6;
}

Assistant:

double integrate(std::function<double(double)> const &func, double a, double b, double h, int threads_num){
  std::vector<Argument> args(static_cast<unsigned long>(threads_num));
  std::vector<pthread_t> threads(static_cast<unsigned long>(threads_num));
  pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  if (b < a){
    std::swap(a, b);
  }
  double result = 0;
  double step = (b - a) / threads_num;
  for(auto i = 0; i < threads_num; ++i){
    args[i] = {&mutex, &result, a + step * i, a + step * (i + 1), h, &func};
    pthread_create(threads.data() + i, nullptr, integrate_thread, args.data() + i);
  }
  for(auto i = 0; i < threads_num; ++i) {
    pthread_join(threads[i], nullptr);
  }
  return result;
}